

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O1

FT_Error cff_font_load(FT_Library library,FT_Stream stream,FT_Int face_index,CFF_Font_conflict font,
                      CFF_Face face,FT_Bool pure_cff,FT_Bool cff2)

{
  uint uVar1;
  FT_Memory memory;
  FT_Error FVar2;
  byte bVar3;
  FT_UInt16 FVar4;
  FT_ULong base_offset;
  FT_ULong FVar5;
  FT_String *pFVar6;
  CFF_SubFont pCVar7;
  ulong uVar8;
  FT_UInt font_index;
  undefined7 in_register_00000089;
  FT_UInt code;
  bool bVar9;
  FT_Error error;
  undefined4 local_c8;
  uint local_c4;
  CFF_Face local_c0;
  CFF_IndexRec string_index;
  CFF_IndexRec fd_index;
  
  local_c8 = (undefined4)CONCAT71(in_register_00000089,pure_cff);
  memory = stream->memory;
  local_c0 = face;
  memset(font,0,0x13c0);
  string_index.stream = (FT_Stream)0x0;
  string_index.start = 0;
  string_index.hdr_size = 0;
  string_index.count = 0;
  string_index.off_size = '\0';
  string_index._25_7_ = 0;
  string_index.data_offset = 0;
  string_index.data_size = 0;
  string_index.offsets = (FT_ULong *)0x0;
  string_index.bytes = (FT_Byte *)0x0;
  base_offset = FT_Stream_Pos(stream);
  font->library = library;
  font->stream = stream;
  font->memory = memory;
  font->cff2 = cff2;
  font->base_offset = base_offset;
  error = FT_Stream_ReadFields(stream,cff_font_load::cff_header_fields,font);
  if (error != 0) goto LAB_002274df;
  if (cff2 == '\0') {
    bVar3 = FT_Stream_ReadByte(stream,&error);
    if (error != 0) goto LAB_002274df;
    if (((font->version_major == '\x01') && (3 < font->header_size)) && (bVar3 < 5))
    goto LAB_002274b9;
  }
  else if ((font->version_major == '\x02') && (4 < font->header_size)) {
    FVar4 = FT_Stream_ReadUShort(stream,&error);
    font->top_dict_length = (uint)FVar4;
    if (error != 0) goto LAB_002274df;
LAB_002274b9:
    error = FT_Stream_Seek(stream,font->header_size + base_offset);
    if (error == 0) {
      if (cff2 == '\0') {
        error = cff_index_init(&font->name_index,stream,'\0','\0');
        if (error != 0) goto LAB_002274d0;
        uVar8 = (ulong)(font->name_index).count;
        if ((1 < uVar8) && ((font->name_index).data_size < uVar8)) {
          error = ((char)local_c8 == '\0') + 2;
          goto LAB_002274df;
        }
        error = cff_index_init(&font->font_dict_index,stream,'\0','\0');
        if ((((error != 0) || (error = cff_index_init(&string_index,stream,'\x01','\0'), error != 0)
             ) || (error = cff_index_init(&font->global_subrs_index,stream,'\x01','\0'), error != 0)
            ) || (error = cff_index_get_pointers
                                    (&string_index,&font->strings,&font->string_pool,
                                     &font->string_pool_size), error != 0)) goto LAB_002274df;
        if ((font->name_index).count <= (font->font_dict_index).count) goto LAB_00227575;
      }
      else {
        (font->font_dict_index).offsets = (FT_ULong *)0x0;
        (font->font_dict_index).bytes = (FT_Byte *)0x0;
        (font->font_dict_index).data_offset = 0;
        (font->font_dict_index).data_size = 0;
        (font->font_dict_index).hdr_size = 0;
        (font->font_dict_index).count = 0;
        *(undefined8 *)&(font->font_dict_index).off_size = 0;
        (font->font_dict_index).stream = (FT_Stream)0x0;
        (font->font_dict_index).start = 0;
        FVar5 = FT_Stream_Pos(stream);
        (font->font_dict_index).data_offset = FVar5;
        uVar1 = font->top_dict_length;
        (font->font_dict_index).data_size = (ulong)uVar1;
        error = FT_Stream_Skip(stream,(ulong)uVar1);
        if ((error != 0) ||
           (error = cff_index_init(&font->global_subrs_index,stream,'\x01','\x01'), error != 0))
        goto LAB_002274df;
LAB_00227575:
        font->num_strings = string_index.count;
        if ((char)local_c8 == '\0') {
          font_index = 0;
          if (1 < (font->name_index).count) goto LAB_0022768e;
        }
        else {
          font_index = face_index & 0xffff;
          if ((0 < face_index) && ((font->name_index).count <= font_index)) {
            error = 6;
            goto LAB_002274df;
          }
          font->num_faces = (font->name_index).count;
        }
        if (((face_index < 0) ||
            (error = cff_subfont_load(&font->top_font,&font->font_dict_index,font_index,stream,
                                      base_offset,(uint)(cff2 != '\0') << 0xd | 0x1000,font,local_c0
                                     ), error != 0)) ||
           (error = FT_Stream_Seek(stream,(font->top_font).font_dict.charstrings_offset +
                                          base_offset), error != 0)) goto LAB_002274df;
        local_c4 = (uint)cff2;
        error = cff_index_init(&font->charstrings_index,stream,'\0',cff2);
        if (error != 0) goto LAB_002274df;
        if ((cff2 == '\0') && ((font->top_font).font_dict.cid_registry == 0xffff)) {
          font->num_subfonts = 0;
          error = 0;
        }
        else {
          error = cff_vstore_load(&font->vstore,stream,base_offset,
                                  (font->top_font).font_dict.vstore_offset);
          if ((error != 0) ||
             ((error = FT_Stream_Seek(stream,(font->top_font).font_dict.cid_fd_array_offset +
                                             base_offset), error != 0 ||
              (error = cff_index_init(&fd_index,stream,'\0',(FT_Bool)local_c4), error != 0))))
          goto LAB_002274df;
          if ((ulong)fd_index.count < 0x101) {
            font->num_subfonts = fd_index.count;
            pCVar7 = (CFF_SubFont)
                     ft_mem_realloc(memory,0x4c8,0,(ulong)fd_index.count,(void *)0x0,&error);
            if (error == 0) {
              if ((ulong)fd_index.count != 0) {
                uVar8 = 0;
                do {
                  font->subfonts[uVar8] = pCVar7;
                  uVar8 = uVar8 + 1;
                  pCVar7 = pCVar7 + 1;
                } while (fd_index.count != uVar8);
              }
              if (fd_index.count == 0) {
                bVar9 = false;
              }
              else {
                code = 0x1000;
                if (cff2 != '\0') {
                  code = 0x4000;
                }
                uVar8 = 0;
                FVar2 = error;
                do {
                  error = FVar2;
                  error = cff_subfont_load(font->subfonts[uVar8],&fd_index,(FT_UInt)uVar8,stream,
                                           base_offset,code,font,local_c0);
                  if (error != 0) goto LAB_00227852;
                  uVar8 = uVar8 + 1;
                  FVar2 = 0;
                } while (uVar8 < fd_index.count);
                bVar9 = 1 < fd_index.count;
              }
              if (!(bool)(cff2 != '\0' & (bVar9 ^ 1U))) {
                error = CFF_Load_FD_Select(&font->fd_select,(font->charstrings_index).count,stream,
                                           (font->top_font).font_dict.cid_fd_select_offset +
                                           base_offset);
              }
            }
          }
LAB_00227852:
          cff_index_done(&fd_index);
          if (error != 0) goto LAB_002274df;
        }
        if ((font->top_font).font_dict.charstrings_offset != 0) {
          font->num_glyphs = (font->charstrings_index).count;
          error = cff_index_get_pointers
                            (&font->global_subrs_index,&font->global_subrs,(FT_Byte **)0x0,
                             (FT_ULong *)0x0);
          if (error == 0) {
            if ((cff2 == '\0') && (font->num_glyphs != 0)) {
              error = cff_charset_load(&font->charset,font->num_glyphs,stream,base_offset,
                                       (font->top_font).font_dict.charset_offset,
                                       (char)local_c8 != '\0' &&
                                       (font->top_font).font_dict.cid_registry != 0xffff);
              if ((error != 0) ||
                 (((font->top_font).font_dict.cid_registry == 0xffff &&
                  (error = cff_encoding_load(&font->encoding,&font->charset,font->num_glyphs,stream,
                                             base_offset,(font->top_font).font_dict.encoding_offset)
                  , error != 0)))) goto LAB_002274df;
            }
            pFVar6 = cff_index_get_name(font,font_index);
            font->font_name = pFVar6;
          }
          goto LAB_002274df;
        }
      }
LAB_0022768e:
      error = 3;
      goto LAB_002274df;
    }
LAB_002274d0:
    if ((char)local_c8 == '\0') goto LAB_002274df;
  }
  error = 2;
LAB_002274df:
  cff_index_done(&string_index);
  return error;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_font_load( FT_Library library,
                 FT_Stream  stream,
                 FT_Int     face_index,
                 CFF_Font   font,
                 CFF_Face   face,
                 FT_Bool    pure_cff,
                 FT_Bool    cff2 )
  {
    static const FT_Frame_Field  cff_header_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  CFF_FontRec

      FT_FRAME_START( 3 ),
        FT_FRAME_BYTE( version_major ),
        FT_FRAME_BYTE( version_minor ),
        FT_FRAME_BYTE( header_size ),
      FT_FRAME_END
    };

    FT_Error         error;
    FT_Memory        memory = stream->memory;
    FT_ULong         base_offset;
    CFF_FontRecDict  dict;
    CFF_IndexRec     string_index;
    FT_UInt          subfont_index;


    FT_ZERO( font );
    FT_ZERO( &string_index );

    dict        = &font->top_font.font_dict;
    base_offset = FT_STREAM_POS();

    font->library     = library;
    font->stream      = stream;
    font->memory      = memory;
    font->cff2        = cff2;
    font->base_offset = base_offset;

    /* read CFF font header */
    if ( FT_STREAM_READ_FIELDS( cff_header_fields, font ) )
      goto Exit;

    if ( cff2 )
    {
      if ( font->version_major != 2 ||
           font->header_size < 5    )
      {
        FT_TRACE2(( "  not a CFF2 font header\n" ));
        error = FT_THROW( Unknown_File_Format );
        goto Exit;
      }

      if ( FT_READ_USHORT( font->top_dict_length ) )
        goto Exit;
    }
    else
    {
      FT_Byte  absolute_offset;


      if ( FT_READ_BYTE( absolute_offset ) )
        goto Exit;

      if ( font->version_major != 1 ||
           font->header_size < 4    ||
           absolute_offset > 4      )
      {
        FT_TRACE2(( "  not a CFF font header\n" ));
        error = FT_THROW( Unknown_File_Format );
        goto Exit;
      }
    }

    /* skip the rest of the header */
    if ( FT_STREAM_SEEK( base_offset + font->header_size ) )
    {
      /* For pure CFFs we have read only four bytes so far.  Contrary to */
      /* other formats like SFNT those bytes doesn't define a signature; */
      /* it is thus possible that the font isn't a CFF at all.           */
      if ( pure_cff )
      {
        FT_TRACE2(( "  not a CFF file\n" ));
        error = FT_THROW( Unknown_File_Format );
      }
      goto Exit;
    }

    if ( cff2 )
    {
      /* For CFF2, the top dict data immediately follow the header    */
      /* and the length is stored in the header `offSize' field;      */
      /* there is no index for it.                                    */
      /*                                                              */
      /* Use the `font_dict_index' to save the current position       */
      /* and length of data, but leave count at zero as an indicator. */
      FT_ZERO( &font->font_dict_index );

      font->font_dict_index.data_offset = FT_STREAM_POS();
      font->font_dict_index.data_size   = font->top_dict_length;

      /* skip the top dict data for now, we will parse it later */
      if ( FT_STREAM_SKIP( font->top_dict_length ) )
        goto Exit;

      /* next, read the global subrs index */
      if ( FT_SET_ERROR( cff_index_init( &font->global_subrs_index,
                                         stream, 1, cff2 ) ) )
        goto Exit;
    }
    else
    {
      /* for CFF, read the name, top dict, string and global subrs index */
      if ( FT_SET_ERROR( cff_index_init( &font->name_index,
                                         stream, 0, cff2 ) ) )
      {
        if ( pure_cff )
        {
          FT_TRACE2(( "  not a CFF file\n" ));
          error = FT_THROW( Unknown_File_Format );
        }
        goto Exit;
      }

      /* if we have an empty font name,      */
      /* it must be the only font in the CFF */
      if ( font->name_index.count > 1                          &&
           font->name_index.data_size < font->name_index.count )
      {
        /* for pure CFFs, we still haven't checked enough bytes */
        /* to be sure that it is a CFF at all                   */
        error = pure_cff ? FT_THROW( Unknown_File_Format )
                         : FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      if ( FT_SET_ERROR( cff_index_init( &font->font_dict_index,
                                         stream, 0, cff2 ) )                 ||
           FT_SET_ERROR( cff_index_init( &string_index,
                                         stream, 1, cff2 ) )                 ||
           FT_SET_ERROR( cff_index_init( &font->global_subrs_index,
                                         stream, 1, cff2 ) )                 ||
           FT_SET_ERROR( cff_index_get_pointers( &string_index,
                                                 &font->strings,
                                                 &font->string_pool,
                                                 &font->string_pool_size ) ) )
        goto Exit;

      /* there must be a Top DICT index entry for each name index entry */
      if ( font->name_index.count > font->font_dict_index.count )
      {
        FT_ERROR(( "cff_font_load:"
                   " not enough entries in Top DICT index\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }
    }

    font->num_strings = string_index.count;

    if ( pure_cff )
    {
      /* well, we don't really forget the `disabled' fonts... */
      subfont_index = (FT_UInt)( face_index & 0xFFFF );

      if ( face_index > 0 && subfont_index >= font->name_index.count )
      {
        FT_ERROR(( "cff_font_load:"
                   " invalid subfont index for pure CFF font (%d)\n",
                   subfont_index ));
        error = FT_THROW( Invalid_Argument );
        goto Exit;
      }

      font->num_faces = font->name_index.count;
    }
    else
    {
      subfont_index = 0;

      if ( font->name_index.count > 1 )
      {
        FT_ERROR(( "cff_font_load:"
                   " invalid CFF font with multiple subfonts\n" ));
        FT_ERROR(( "              "
                   " in SFNT wrapper\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }
    }

    /* in case of a font format check, simply exit now */
    if ( face_index < 0 )
      goto Exit;

    /* now, parse the top-level font dictionary */
    FT_TRACE4(( "parsing top-level\n" ));
    error = cff_subfont_load( &font->top_font,
                              &font->font_dict_index,
                              subfont_index,
                              stream,
                              base_offset,
                              cff2 ? CFF2_CODE_TOPDICT : CFF_CODE_TOPDICT,
                              font,
                              face );
    if ( error )
      goto Exit;

    if ( FT_STREAM_SEEK( base_offset + dict->charstrings_offset ) )
      goto Exit;

    error = cff_index_init( &font->charstrings_index, stream, 0, cff2 );
    if ( error )
      goto Exit;

    /* now, check for a CID or CFF2 font */
    if ( dict->cid_registry != 0xFFFFU ||
         cff2                          )
    {
      CFF_IndexRec  fd_index;
      CFF_SubFont   sub = NULL;
      FT_UInt       idx;


      /* for CFF2, read the Variation Store if available;                 */
      /* this must follow the Top DICT parse and precede any Private DICT */
      error = cff_vstore_load( &font->vstore,
                               stream,
                               base_offset,
                               dict->vstore_offset );
      if ( error )
        goto Exit;

      /* this is a CID-keyed font, we must now allocate a table of */
      /* sub-fonts, then load each of them separately              */
      if ( FT_STREAM_SEEK( base_offset + dict->cid_fd_array_offset ) )
        goto Exit;

      error = cff_index_init( &fd_index, stream, 0, cff2 );
      if ( error )
        goto Exit;

      /* Font Dicts are not limited to 256 for CFF2. */
      /* TODO: support this for CFF2                 */
      if ( fd_index.count > CFF_MAX_CID_FONTS )
      {
        FT_TRACE0(( "cff_font_load: FD array too large in CID font\n" ));
        goto Fail_CID;
      }

      /* allocate & read each font dict independently */
      font->num_subfonts = fd_index.count;
      if ( FT_NEW_ARRAY( sub, fd_index.count ) )
        goto Fail_CID;

      /* set up pointer table */
      for ( idx = 0; idx < fd_index.count; idx++ )
        font->subfonts[idx] = sub + idx;

      /* now load each subfont independently */
      for ( idx = 0; idx < fd_index.count; idx++ )
      {
        sub = font->subfonts[idx];
        FT_TRACE4(( "parsing subfont %u\n", idx ));
        error = cff_subfont_load( sub,
                                  &fd_index,
                                  idx,
                                  stream,
                                  base_offset,
                                  cff2 ? CFF2_CODE_FONTDICT
                                       : CFF_CODE_TOPDICT,
                                  font,
                                  face );
        if ( error )
          goto Fail_CID;
      }

      /* now load the FD Select array;               */
      /* CFF2 omits FDSelect if there is only one FD */
      if ( !cff2 || fd_index.count > 1 )
        error = CFF_Load_FD_Select( &font->fd_select,
                                    font->charstrings_index.count,
                                    stream,
                                    base_offset + dict->cid_fd_select_offset );

    Fail_CID:
      cff_index_done( &fd_index );

      if ( error )
        goto Exit;
    }
    else
      font->num_subfonts = 0;

    /* read the charstrings index now */
    if ( dict->charstrings_offset == 0 )
    {
      FT_ERROR(( "cff_font_load: no charstrings offset\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    font->num_glyphs = font->charstrings_index.count;

    error = cff_index_get_pointers( &font->global_subrs_index,
                                    &font->global_subrs, NULL, NULL );

    if ( error )
      goto Exit;

    /* read the Charset and Encoding tables if available */
    if ( !cff2 && font->num_glyphs > 0 )
    {
      FT_Bool  invert = FT_BOOL( dict->cid_registry != 0xFFFFU && pure_cff );


      error = cff_charset_load( &font->charset, font->num_glyphs, stream,
                                base_offset, dict->charset_offset, invert );
      if ( error )
        goto Exit;

      /* CID-keyed CFFs don't have an encoding */
      if ( dict->cid_registry == 0xFFFFU )
      {
        error = cff_encoding_load( &font->encoding,
                                   &font->charset,
                                   font->num_glyphs,
                                   stream,
                                   base_offset,
                                   dict->encoding_offset );
        if ( error )
          goto Exit;
      }
    }

    /* get the font name (/CIDFontName for CID-keyed fonts, */
    /* /FontName otherwise)                                 */
    font->font_name = cff_index_get_name( font, subfont_index );

  Exit:
    cff_index_done( &string_index );

    return error;
  }